

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::PreservingSwapTest::iterate(PreservingSwapTest *this)

{
  EGLint width_00;
  EGLint height_00;
  deUint32 dVar1;
  deBool dVar2;
  Library *egl_00;
  int x;
  int y;
  float red;
  float green;
  float blue;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool local_159;
  bool local_155;
  bool local_153;
  int y2i;
  int x2i;
  int y1i;
  int x1i;
  int py;
  int px;
  int oy;
  int ox;
  bool isOk;
  Surface preSwapFramebuffer;
  Surface postSwapFramebuffer;
  Surface preSwapFramebufferReference;
  Surface postSwapFramebufferReference;
  float postSwapY2;
  float postSwapX2;
  float postSwapY1;
  float postSwapX1;
  float preSwapY2;
  float preSwapX2;
  float preSwapY1;
  float preSwapX1;
  float clearAlpha;
  float clearBlue;
  float clearGreen;
  float clearRed;
  int height;
  undefined1 local_30 [4];
  int width;
  Random rnd;
  TestLog *log;
  Library *egl;
  PreservingSwapTest *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  de::Random::Random((Random *)local_30,this->m_seed);
  width_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3057);
  height_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3056);
  red = de::Random::getFloat((Random *)local_30);
  green = de::Random::getFloat((Random *)local_30);
  blue = de::Random::getFloat((Random *)local_30);
  fVar3 = de::Random::getFloat((Random *)local_30);
  fVar3 = fVar3 * -0.9;
  fVar4 = de::Random::getFloat((Random *)local_30);
  fVar4 = fVar4 * -0.9;
  fVar5 = de::Random::getFloat((Random *)local_30);
  fVar5 = fVar5 * 0.9;
  fVar6 = de::Random::getFloat((Random *)local_30);
  fVar6 = fVar6 * 0.9;
  fVar7 = de::Random::getFloat((Random *)local_30);
  fVar7 = fVar7 * -0.9;
  fVar8 = de::Random::getFloat((Random *)local_30);
  fVar8 = fVar8 * -0.9;
  fVar9 = de::Random::getFloat((Random *)local_30);
  fVar9 = fVar9 * 0.9;
  fVar10 = de::Random::getFloat((Random *)local_30);
  fVar10 = fVar10 * 0.9;
  tcu::Surface::Surface((Surface *)&preSwapFramebufferReference.m_pixels.m_cap,width_00,height_00);
  tcu::Surface::Surface((Surface *)&postSwapFramebuffer.m_pixels.m_cap,width_00,height_00);
  tcu::Surface::Surface((Surface *)&preSwapFramebuffer.m_pixels.m_cap,width_00,height_00);
  tcu::Surface::Surface((Surface *)&ox,width_00,height_00);
  if ((this->m_preserveColorbuffer & 1U) != 0) {
    do {
      (*egl_00->_vptr_Library[0x30])(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3094);
      dVar1 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,
                       "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                       ,0x1c1);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  do {
    (*egl_00->_vptr_Library[0x27])
              (egl_00,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x1c3);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  clearColorScreen(&this->m_gl,red,green,blue,1.0);
  if ((this->m_readPixelsBeforeSwap & 1U) != 0) {
    clearColorReference((Surface *)&postSwapFramebuffer.m_pixels.m_cap,red,green,blue,1.0);
  }
  clearColorReference((Surface *)&preSwapFramebufferReference.m_pixels.m_cap,red,green,blue,1.0);
  if (this->m_preSwapDrawType != DRAWTYPE_NONE) {
    GLES2Program::render
              (this->m_gles2Program,width_00,height_00,fVar3,fVar4,fVar5,fVar6,
               this->m_preSwapDrawType);
    ReferenceProgram::render
              (this->m_refProgram,(Surface *)&preSwapFramebufferReference.m_pixels.m_cap,fVar3,fVar4
               ,fVar5,fVar6,this->m_preSwapDrawType);
  }
  if ((this->m_readPixelsBeforeSwap & 1U) != 0) {
    if (this->m_preSwapDrawType != DRAWTYPE_NONE) {
      ReferenceProgram::render
                (this->m_refProgram,(Surface *)&postSwapFramebuffer.m_pixels.m_cap,fVar3,fVar4,fVar5
                 ,fVar6,this->m_preSwapDrawType);
    }
    readPixels(&this->m_gl,(Surface *)&ox);
  }
  do {
    (*egl_00->_vptr_Library[0x31])(egl_00,this->m_eglDisplay,this->m_eglSurface);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"swapBuffers(m_eglDisplay, m_eglSurface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPreservingSwapTests.cpp"
                     ,0x1da);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (this->m_postSwapDrawType != DRAWTYPE_NONE) {
    ReferenceProgram::render
              (this->m_refProgram,(Surface *)&preSwapFramebufferReference.m_pixels.m_cap,fVar7,fVar8
               ,fVar9,fVar10,this->m_postSwapDrawType);
    GLES2Program::render
              (this->m_gles2Program,width_00,height_00,fVar7,fVar8,fVar9,fVar10,
               this->m_postSwapDrawType);
  }
  readPixels(&this->m_gl,(Surface *)&preSwapFramebuffer.m_pixels.m_cap);
  oy._3_1_ = true;
  if ((this->m_preserveColorbuffer & 1U) == 0) {
    x = (int)(((float)width_00 / 2.0) * fVar7 + (float)(width_00 / 2));
    y = (int)(((float)height_00 / 2.0) * fVar8 + (float)(height_00 / 2));
    if ((this->m_readPixelsBeforeSwap & 1U) != 0) {
      oy._3_1_ = compareToReference((TestLog *)rnd.m_rnd._8_8_,
                                    "Compare pre-swap framebuffer to reference",
                                    "Compare pre-swap framebuffer to reference",
                                    (Surface *)&postSwapFramebuffer.m_pixels.m_cap,(Surface *)&ox,0,
                                    0,width_00,height_00);
    }
    local_159 = false;
    if (oy._3_1_ != false) {
      local_159 = compareToReference((TestLog *)rnd.m_rnd._8_8_,
                                     "Compare valid are of post-swap framebuffer to reference",
                                     "Compare valid area of post-swap framebuffer to reference",
                                     (Surface *)&preSwapFramebufferReference.m_pixels.m_cap,
                                     (Surface *)&preSwapFramebuffer.m_pixels.m_cap,x,y,
                                     (int)(((float)width_00 / 2.0) * fVar9 + (float)(width_00 / 2))
                                     - x,(int)(((float)height_00 / 2.0) * fVar10 +
                                              (float)(height_00 / 2)) - y);
    }
    oy._3_1_ = local_159;
  }
  else {
    if ((this->m_readPixelsBeforeSwap & 1U) != 0) {
      oy._3_1_ = compareToReference((TestLog *)rnd.m_rnd._8_8_,
                                    "Compare pre-swap framebuffer to reference",
                                    "Compare pre-swap framebuffer to reference",
                                    (Surface *)&postSwapFramebuffer.m_pixels.m_cap,(Surface *)&ox,0,
                                    0,width_00,height_00);
    }
    local_153 = false;
    if (oy._3_1_ != false) {
      local_153 = compareToReference((TestLog *)rnd.m_rnd._8_8_,
                                     "Compare post-swap framebuffer to reference",
                                     "Compare post-swap framebuffer to reference",
                                     (Surface *)&preSwapFramebufferReference.m_pixels.m_cap,
                                     (Surface *)&preSwapFramebuffer.m_pixels.m_cap,0,0,width_00,
                                     height_00);
    }
    oy._3_1_ = local_153;
    if (((this->m_readPixelsBeforeSwap & 1U) != 0) && (this->m_postSwapDrawType == DRAWTYPE_NONE)) {
      local_155 = false;
      if (local_153 != false) {
        local_155 = comparePreAndPostSwapFramebuffers
                              ((TestLog *)rnd.m_rnd._8_8_,(Surface *)&ox,
                               (Surface *)&preSwapFramebuffer.m_pixels.m_cap);
      }
      oy._3_1_ = local_155;
    }
  }
  if (oy._3_1_ == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  tcu::Surface::~Surface((Surface *)&ox);
  tcu::Surface::~Surface((Surface *)&preSwapFramebuffer.m_pixels.m_cap);
  tcu::Surface::~Surface((Surface *)&postSwapFramebuffer.m_pixels.m_cap);
  tcu::Surface::~Surface((Surface *)&preSwapFramebufferReference.m_pixels.m_cap);
  de::Random::~Random((Random *)local_30);
  return STOP;
}

Assistant:

TestCase::IterateResult PreservingSwapTest::iterate (void)
{
	const Library&	egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log				= m_testCtx.getLog();
	de::Random		rnd(m_seed);

	const int		width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);

	const float		clearRed		= rnd.getFloat();
	const float		clearGreen		= rnd.getFloat();
	const float		clearBlue		= rnd.getFloat();
	const float		clearAlpha		= 1.0f;

	const float		preSwapX1		= -0.9f * rnd.getFloat();
	const float		preSwapY1		= -0.9f * rnd.getFloat();
	const float		preSwapX2		= 0.9f * rnd.getFloat();
	const float		preSwapY2		= 0.9f * rnd.getFloat();

	const float		postSwapX1		= -0.9f * rnd.getFloat();
	const float		postSwapY1		= -0.9f * rnd.getFloat();
	const float		postSwapX2		= 0.9f * rnd.getFloat();
	const float		postSwapY2		= 0.9f * rnd.getFloat();

	tcu::Surface	postSwapFramebufferReference(width, height);
	tcu::Surface	preSwapFramebufferReference(width, height);

	tcu::Surface	postSwapFramebuffer(width, height);
	tcu::Surface	preSwapFramebuffer(width, height);

	if (m_preserveColorbuffer)
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

	clearColorScreen(m_gl, clearRed, clearGreen, clearBlue, clearAlpha);

	if (m_readPixelsBeforeSwap)
		clearColorReference(&preSwapFramebufferReference, clearRed, clearGreen, clearBlue, clearAlpha);

	clearColorReference(&postSwapFramebufferReference, clearRed, clearGreen, clearBlue, clearAlpha);

	if (m_preSwapDrawType != DRAWTYPE_NONE)
	{
		m_gles2Program->render(width, height, preSwapX1, preSwapY1, preSwapX2, preSwapY2, m_preSwapDrawType);
		m_refProgram->render(&postSwapFramebufferReference, preSwapX1, preSwapY1, preSwapX2, preSwapY2, m_preSwapDrawType);
	}

	if (m_readPixelsBeforeSwap)
	{
		if (m_preSwapDrawType != DRAWTYPE_NONE)
			m_refProgram->render(&preSwapFramebufferReference, preSwapX1, preSwapY1, preSwapX2, preSwapY2, m_preSwapDrawType);

		readPixels(m_gl, &preSwapFramebuffer);
	}

	EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

	if (m_postSwapDrawType != DRAWTYPE_NONE)
	{
		m_refProgram->render(&postSwapFramebufferReference, postSwapX1, postSwapY1, postSwapX2, postSwapY2, m_postSwapDrawType);
		m_gles2Program->render(width, height, postSwapX1, postSwapY1, postSwapX2, postSwapY2, m_postSwapDrawType);
	}

	readPixels(m_gl, &postSwapFramebuffer);

	bool isOk = true;

	if (m_preserveColorbuffer)
	{
		if (m_readPixelsBeforeSwap)
			isOk = isOk && compareToReference(log, "Compare pre-swap framebuffer to reference", "Compare pre-swap framebuffer to reference", preSwapFramebufferReference, preSwapFramebuffer, 0, 0, width, height);

		isOk = isOk && compareToReference(log, "Compare post-swap framebuffer to reference", "Compare post-swap framebuffer to reference", postSwapFramebufferReference, postSwapFramebuffer, 0, 0, width, height);

		if (m_readPixelsBeforeSwap && m_postSwapDrawType == PreservingSwapTest::DRAWTYPE_NONE)
			isOk = isOk && comparePreAndPostSwapFramebuffers(log, preSwapFramebuffer, postSwapFramebuffer);
	}
	else
	{
		const int ox	= width/2;
		const int oy	= height/2;

		const int px	= width;
		const int py	= height;

		const int x1i	= (int)(((float)px/2.0f) * postSwapX1 + (float)ox);
		const int y1i	= (int)(((float)py/2.0f) * postSwapY1 + (float)oy);

		const int x2i	= (int)(((float)px/2.0f) * postSwapX2 + (float)ox);
		const int y2i	= (int)(((float)py/2.0f) * postSwapY2 + (float)oy);

		if (m_readPixelsBeforeSwap)
			isOk = isOk && compareToReference(log, "Compare pre-swap framebuffer to reference", "Compare pre-swap framebuffer to reference", preSwapFramebufferReference, preSwapFramebuffer, 0, 0, width, height);

		DE_ASSERT(m_postSwapDrawType != DRAWTYPE_NONE);
		isOk = isOk && compareToReference(log, "Compare valid are of post-swap framebuffer to reference", "Compare valid area of post-swap framebuffer to reference", postSwapFramebufferReference, postSwapFramebuffer, x1i, y1i, x2i - x1i, y2i - y1i);
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}